

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::TemplatedFetchRow<double>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,idx_t row_idx
               ,Vector *result,idx_t result_idx)

{
  UpdateInfo *current;
  UndoBufferPointer update_ptr;
  double *result_data;
  anon_class_24_3_1deac13e local_a0;
  UndoBufferPointer local_88;
  double *local_70;
  idx_t local_68;
  idx_t local_60;
  UndoBufferReference local_58;
  
  local_a0.row_idx = &local_60;
  local_a0.result_idx = &local_68;
  local_70 = (double *)result->data;
  local_a0.result_data = &local_70;
  local_68 = result_idx;
  local_60 = row_idx;
  if ((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
     ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
    TemplatedFetchRow<double>::anon_class_24_3_1deac13e::operator()(&local_a0,info);
  }
  local_88.entry = (info->next).entry;
  local_88.position = (info->next).position;
  while (local_88.entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin(&local_58,&local_88);
    current = (UpdateInfo *)UndoBufferReference::Ptr(&local_58);
    if ((start_time < (current->version_number).super___atomic_base<unsigned_long>._M_i) &&
       ((current->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) {
      TemplatedFetchRow<double>::anon_class_24_3_1deac13e::operator()(&local_a0,current);
    }
    local_88.entry = (current->next).entry;
    local_88.position = (current->next).position;
    BufferHandle::~BufferHandle(&local_58.handle);
  }
  return;
}

Assistant:

static void TemplatedFetchRow(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, idx_t row_idx,
                              Vector &result, idx_t result_idx) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id, [&](UpdateInfo &current) {
		auto info_data = current.GetData<T>();
		auto tuples = current.GetTuples();
		// FIXME: we could do a binary search in here
		for (idx_t i = 0; i < current.N; i++) {
			if (tuples[i] == row_idx) {
				result_data[result_idx] = info_data[i];
				break;
			} else if (tuples[i] > row_idx) {
				break;
			}
		}
	});
}